

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

StbUndoRecord * ImStb::stb_text_create_undo_record(StbUndoState *state,int numchars)

{
  short sVar1;
  int numchars_local;
  StbUndoState *state_local;
  
  stb_textedit_flush_redo(state);
  if (state->undo_point == 99) {
    stb_textedit_discard_undo(state);
  }
  if (numchars < 1000) {
    while (999 < state->undo_char_point + numchars) {
      stb_textedit_discard_undo(state);
    }
    sVar1 = state->undo_point;
    state->undo_point = sVar1 + 1;
    state_local = (StbUndoState *)(state->undo_rec + sVar1);
  }
  else {
    state->undo_point = 0;
    state->undo_char_point = 0;
    state_local = (StbUndoState *)0x0;
  }
  return state_local->undo_rec;
}

Assistant:

static StbUndoRecord *stb_text_create_undo_record(StbUndoState *state, int numchars)
{
   // any time we create a new undo record, we discard redo
   stb_textedit_flush_redo(state);

   // if we have no free records, we have to make room, by sliding the
   // existing records down
   if (state->undo_point == STB_TEXTEDIT_UNDOSTATECOUNT)
      stb_textedit_discard_undo(state);

   // if the characters to store won't possibly fit in the buffer, we can't undo
   if (numchars > STB_TEXTEDIT_UNDOCHARCOUNT) {
      state->undo_point = 0;
      state->undo_char_point = 0;
      return NULL;
   }

   // if we don't have enough free characters in the buffer, we have to make room
   while (state->undo_char_point + numchars > STB_TEXTEDIT_UNDOCHARCOUNT)
      stb_textedit_discard_undo(state);

   return &state->undo_rec[state->undo_point++];
}